

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O2

int __thiscall
DirectionalScannerO1::first(DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int x;
  bool *pbVar4;
  int iVar5;
  bool *pbVar6;
  int y;
  Pt2i PStack_38;
  
  x = (this->super_DirectionalScanner).lcx;
  y = (this->super_DirectionalScanner).lcy;
  pbVar6 = (this->super_DirectionalScanner).lst2;
  iVar1 = (this->super_DirectionalScanner).dla;
  iVar2 = (this->super_DirectionalScanner).dlb;
  iVar3 = (this->super_DirectionalScanner).dlc2;
  for (iVar5 = y * iVar2;
      (((this->super_DirectionalScanner).xmax <= x || (y < (this->super_DirectionalScanner).ymin))
      && (iVar3 <= iVar1 * x + iVar5)); iVar5 = iVar5 + iVar2) {
    x = x - (uint)*pbVar6;
    y = y + 1;
    pbVar6 = pbVar6 + 1;
    if ((this->super_DirectionalScanner).fs <= pbVar6) {
      pbVar6 = (this->super_DirectionalScanner).steps;
    }
  }
  for (; ((iVar3 <= iVar2 * y + iVar1 * x && ((this->super_DirectionalScanner).xmin <= x)) &&
         (y < (this->super_DirectionalScanner).ymax)); y = y + 1) {
    Pt2i::Pt2i(&PStack_38,x,y);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
    pbVar4 = pbVar6 + 1;
    if ((this->super_DirectionalScanner).fs <= pbVar4) {
      pbVar4 = (this->super_DirectionalScanner).steps;
    }
    x = x - (uint)*pbVar6;
    iVar1 = (this->super_DirectionalScanner).dla;
    iVar2 = (this->super_DirectionalScanner).dlb;
    iVar3 = (this->super_DirectionalScanner).dlc2;
    pbVar6 = pbVar4;
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::first (std::vector<Pt2i> &scan) const
{
  int x = lcx, y = lcy;      // Current position coordinates
  bool *nst = lst2;          // Current step in scan direction (jpts)

  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}